

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_grouping.cpp
# Opt level: O2

bool __thiscall
icu_63::number::impl::Grouper::groupAtPosition
          (Grouper *this,int32_t position,DecimalQuantity *value)

{
  short sVar1;
  bool bVar2;
  int32_t iVar3;
  
  sVar1 = this->fGrouping1;
  if (((sVar1 != 0) && (sVar1 != -1)) && (-1 < position - sVar1)) {
    if ((position - sVar1) % (int)this->fGrouping2 == 0) {
      iVar3 = DecimalQuantity::getUpperDisplayMagnitude(value);
      bVar2 = (int)this->fMinGrouping <= (iVar3 - this->fGrouping1) + 1;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool Grouper::groupAtPosition(int32_t position, const impl::DecimalQuantity &value) const {
    U_ASSERT(fGrouping1 > -2);
    if (fGrouping1 == -1 || fGrouping1 == 0) {
        // Either -1 or 0 means "no grouping"
        return false;
    }
    position -= fGrouping1;
    return position >= 0 && (position % fGrouping2) == 0
           && value.getUpperDisplayMagnitude() - fGrouping1 + 1 >= fMinGrouping;
}